

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

config_value * config_value_create_string(char *string)

{
  config_value *value;
  char *string_local;
  
  string_local = (char *)malloc(0x10);
  if (string_local == (char *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    string_local[0] = '\x03';
    string_local[1] = '\0';
    string_local[2] = '\0';
    string_local[3] = '\0';
    *(char **)(string_local + 8) = string;
  }
  return (config_value *)string_local;
}

Assistant:

struct config_value *config_value_create_string(char *string)
{
        struct config_value *value = malloc(sizeof(struct config_value));

        if (value == NULL) {
                return NULL;
        }

        value->type = STRING;
        value->data.string = string;

        return value;
}